

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O2

int utflen(lua_State *L)

{
  int iVar1;
  size_t in_RAX;
  char *pcVar2;
  long lVar3;
  lua_Integer lVar4;
  char *pcVar5;
  long lVar6;
  lua_Integer n;
  size_t len;
  
  len = in_RAX;
  pcVar2 = luaL_checklstring(L,1,&len);
  lVar3 = luaL_optinteger(L,2,1);
  if (lVar3 < 0) {
    if (len < (ulong)-lVar3) {
      lVar3 = 0;
    }
    else {
      lVar3 = lVar3 + len + 1;
    }
  }
  lVar4 = luaL_optinteger(L,3,-1);
  if (lVar4 < 0) {
    if (len < (ulong)-lVar4) {
      lVar4 = 0;
    }
    else {
      lVar4 = lVar4 + len + 1;
    }
  }
  iVar1 = lua_toboolean(L,4);
  lVar6 = lVar3 + -1;
  if ((lVar3 < 1) || (lVar3 = lVar6, (long)len < lVar6)) {
    lVar6 = lVar3;
    luaL_argerror(L,2,"initial position out of bounds");
  }
  if ((long)len < lVar4) {
    luaL_argerror(L,3,"final position out of bounds");
  }
  n = 0;
  do {
    if (lVar4 <= lVar6) {
      iVar1 = 1;
LAB_0012002d:
      lua_pushinteger(L,n);
      return iVar1;
    }
    pcVar5 = utf8_decode(pcVar2 + lVar6,(l_uint32 *)0x0,(uint)(iVar1 == 0));
    if (pcVar5 == (char *)0x0) {
      lua_pushnil(L);
      n = lVar6 + 1;
      iVar1 = 2;
      goto LAB_0012002d;
    }
    lVar6 = (long)pcVar5 - (long)pcVar2;
    n = n + 1;
  } while( true );
}

Assistant:

static int utflen (lua_State *L) {
  lua_Integer n = 0;  /* counter for the number of characters */
  size_t len;  /* string length in bytes */
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Integer posi = u_posrelat(luaL_optinteger(L, 2, 1), len);
  lua_Integer posj = u_posrelat(luaL_optinteger(L, 3, -1), len);
  int lax = lua_toboolean(L, 4);
  luaL_argcheck(L, 1 <= posi && --posi <= (lua_Integer)len, 2,
                   "initial position out of bounds");
  luaL_argcheck(L, --posj < (lua_Integer)len, 3,
                   "final position out of bounds");
  while (posi <= posj) {
    const char *s1 = utf8_decode(s + posi, NULL, !lax);
    if (s1 == NULL) {  /* conversion error? */
      luaL_pushfail(L);  /* return fail ... */
      lua_pushinteger(L, posi + 1);  /* ... and current position */
      return 2;
    }
    posi = ct_diff2S(s1 - s);
    n++;
  }
  lua_pushinteger(L, n);
  return 1;
}